

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O1

int Abc_NtkCheckRecursive(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieCec.c"
                  ,0x279,"int Abc_NtkCheckRecursive(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[8] != 0) {
    __assert_fail("!Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieCec.c"
                  ,0x27a,"int Abc_NtkCheckRecursive(Abc_Ntk_t *)");
  }
  iVar4 = 0;
  if ((pNtk->pDesign != (Abc_Des_t *)0x0) &&
     (pVVar1 = pNtk->pDesign->vModules, iVar4 = 0, 0 < pVVar1->nSize)) {
    lVar7 = 0;
    iVar4 = 0;
    do {
      pvVar2 = pVVar1->pArray[lVar7];
      lVar5 = (long)*(int *)(*(long *)((long)pvVar2 + 0x20) + 4);
      if (0 < lVar5) {
        lVar6 = 0;
        do {
          lVar3 = *(long *)(*(long *)(*(long *)((long)pvVar2 + 0x20) + 8) + lVar6 * 8);
          if (((lVar3 != 0) &&
              ((*(uint *)(lVar3 + 0x14) & 0xe) == 8 || (*(uint *)(lVar3 + 0x14) & 0xf) == 10)) &&
             (*(void **)(lVar3 + 0x38) == pvVar2)) {
            printf("WARNING: Model \"%s\" contains a recursive definition.\n",
                   *(undefined8 *)((long)pvVar2 + 8));
            iVar4 = 1;
            break;
          }
          lVar6 = lVar6 + 1;
        } while (lVar5 != lVar6);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar1->nSize);
  }
  return iVar4;
}

Assistant:

int Abc_NtkCheckRecursive( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods;
    Abc_Ntk_t * pModel;
    Abc_Obj_t * pObj;
    int i, k, RetValue = 0;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( !Abc_NtkLatchNum(pNtk) );

    if ( pNtk->pDesign == NULL )
        return RetValue;

    vMods = pNtk->pDesign->vModules;
    Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
    {
        Abc_NtkForEachObj( pModel, pObj, k )
            if ( Abc_ObjIsBox(pObj) && pObj->pData == (void *)pModel )
            {
                printf( "WARNING: Model \"%s\" contains a recursive definition.\n", Abc_NtkName(pModel) );
                RetValue = 1;
                break;
            }
    }
    return RetValue;
}